

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int CompareXform(ON_Xform *a,ON_Xform *b)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  iVar1 = 0;
  while (((int)lVar2 != 0x10 && (iVar1 == 0))) {
    iVar1 = CompareDouble(a->m_xform[0][lVar2],b->m_xform[0][lVar2]);
    lVar2 = lVar2 + 1;
  }
  return iVar1;
}

Assistant:

static int CompareXform( const ON_Xform& a, const ON_Xform& b )
{
  int i,j;
  const double* da = &a.m_xform[0][0];
  const double* db = &b.m_xform[0][0];
  i = 16;
  j = 0;
  while ( i-- && !j)
  {
    j = CompareDouble(*da++,*db++);
  }

  return j;
}